

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlIsMixedElement(void)

{
  int iVar1;
  int iVar2;
  xmlDocPtr val;
  xmlChar *val_00;
  int local_34;
  int n_name;
  xmlChar *name;
  int n_doc;
  xmlDocPtr doc;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (name._4_4_ = 0; (int)name._4_4_ < 4; name._4_4_ = name._4_4_ + 1) {
    for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlDocPtr(name._4_4_,0);
      val_00 = gen_const_xmlChar_ptr(local_34,1);
      iVar2 = xmlIsMixedElement(val,val_00);
      desret_int(iVar2);
      call_tests = call_tests + 1;
      des_xmlDocPtr(name._4_4_,val,0);
      des_const_xmlChar_ptr(local_34,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlIsMixedElement",(ulong)(uint)(iVar2 - iVar1));
        ret_val = ret_val + 1;
        printf(" %d",(ulong)name._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlIsMixedElement(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    xmlDocPtr doc; /* the document */
    int n_doc;
    xmlChar * name; /* the element name */
    int n_name;

    for (n_doc = 0;n_doc < gen_nb_xmlDocPtr;n_doc++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
        mem_base = xmlMemBlocks();
        doc = gen_xmlDocPtr(n_doc, 0);
        name = gen_const_xmlChar_ptr(n_name, 1);

        ret_val = xmlIsMixedElement(doc, (const xmlChar *)name);
        desret_int(ret_val);
        call_tests++;
        des_xmlDocPtr(n_doc, doc, 0);
        des_const_xmlChar_ptr(n_name, (const xmlChar *)name, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlIsMixedElement",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_doc);
            printf(" %d", n_name);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}